

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeHandTrackerDevice.cpp
# Opt level: O3

void __thiscall
MinVR::VRFakeHandTrackerDevice::onVREvent(VRFakeHandTrackerDevice *this,VRDataIndex *event)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  VRAnyCoreType VVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  VRFloatArray screenPos;
  VRDataIndex di;
  VRVector3 pos;
  VRMatrix4 xform;
  float *local_418;
  long local_410;
  long local_408;
  VRFloatArray local_400;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  float local_2c8;
  float fStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined1 local_2b0 [152];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  VRMatrix4 local_1a0;
  VRMatrix4 local_158;
  VRMatrix4 local_110;
  VRDataIndex local_c8;
  
  pcVar1 = (event->_indexName)._M_dataplus._M_p;
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b0,pcVar1,pcVar1 + (event->_indexName)._M_string_length);
  uVar3 = local_2b0._0_8_;
  if (local_2b0._8_8_ == (this->_toggleEvent)._M_string_length) {
    if (local_2b0._8_8_ == 0) {
      bVar6 = true;
    }
    else {
      iVar4 = bcmp((void *)local_2b0._0_8_,(this->_toggleEvent)._M_dataplus._M_p,local_2b0._8_8_);
      bVar6 = iVar4 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  if ((undefined1 *)uVar3 != local_2b0 + 0x10) {
    operator_delete((void *)uVar3,local_2b0._16_8_ + 1);
  }
  if (bVar6) {
    bVar6 = this->_tracking;
    this->_tracking = (bool)(bVar6 ^ 1);
    if (bVar6 != false) {
      return;
    }
  }
  else {
    pcVar1 = (event->_indexName)._M_dataplus._M_p;
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,pcVar1,pcVar1 + (event->_indexName)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1d0,&this->_zKeys);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"Down","");
    bVar6 = eventMatch(&local_2e8,&local_1d0,&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      this->_state = ZTranslating;
      return;
    }
    pcVar1 = (event->_indexName)._M_dataplus._M_p;
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_328,pcVar1,pcVar1 + (event->_indexName)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1e8,&this->_zKeys);
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"Up","");
    bVar6 = eventMatch(&local_328,&local_1e8,&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if (!bVar6) {
      pcVar1 = (event->_indexName)._M_dataplus._M_p;
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_368,pcVar1,pcVar1 + (event->_indexName)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_200,&this->_rotKeys);
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Down","");
      bVar6 = eventMatch(&local_368,&local_200,&local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        this->_state = Rotating;
        return;
      }
      pcVar1 = (event->_indexName)._M_dataplus._M_p;
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3a8,pcVar1,pcVar1 + (event->_indexName)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_218,&this->_rotKeys);
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Up","");
      bVar6 = eventMatch(&local_3a8,&local_218,&local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = local_2b0 + 0x10;
      if (!bVar6) {
        pcVar2 = (event->_indexName)._M_dataplus._M_p;
        local_2b0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b0,pcVar2,pcVar2 + (event->_indexName)._M_string_length);
        iVar4 = std::__cxx11::string::compare((char *)local_2b0);
        if ((pointer)local_2b0._0_8_ != pcVar1) {
          operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
        }
        if (iVar4 != 0) {
          return;
        }
        local_2b0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"NormalizedPosition","")
        ;
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"");
        VVar5 = VRDataIndex::getValue(event,(string *)local_2b0,&local_3e8,true);
        (*(VVar5.datum)->_vptr_VRDatum[0xd])(&local_418,VVar5.datum);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_2b0._0_8_ != pcVar1) {
          operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
        }
        if (4 < (ulong)(local_410 - (long)local_418)) {
          fVar9 = (1.0 - local_418[1]) + -0.5;
          fVar8 = *local_418 + -0.5 + *local_418 + -0.5;
          fVar9 = fVar9 + fVar9;
          uVar10 = 0;
          uVar11 = 0;
          if (this->_tracking == true) {
            fVar7 = fVar9 - this->_lastMouseY;
            local_2c8 = fVar8;
            fStack_2c4 = fVar9;
            uStack_2c0 = uVar10;
            uStack_2bc = uVar11;
            if (this->_state == Rotating) {
              local_1b8 = fVar9;
              fStack_1b4 = fVar9;
              fStack_1b0 = fVar9;
              fStack_1ac = fVar9;
              VRMatrix4::rotationY(&local_1a0,(fVar8 - this->_lastMouseX) * this->_rScale);
              VRMatrix4::rotationX(&local_110,fVar7 * -this->_rScale);
              operator*(&local_158,&local_1a0,&local_110);
              operator*((VRMatrix4 *)local_2b0,&local_158,&this->_R);
              VRMatrix4::operator=(&this->_R,(VRMatrix4 *)local_2b0);
              VRMatrix4::~VRMatrix4((VRMatrix4 *)local_2b0);
              VRMatrix4::~VRMatrix4(&local_158);
              VRMatrix4::~VRMatrix4(&local_110);
              VRMatrix4::~VRMatrix4(&local_1a0);
              fVar9 = local_1b8;
            }
            else if (this->_state == ZTranslating) {
              this->_z = fVar7 * this->_zScale + this->_z;
            }
            VRVector3::VRVector3
                      ((VRVector3 *)&local_1a0,local_2c8 * this->_xyScale,fVar9 * this->_xyScale,
                       this->_z);
            VRMatrix4::translation((VRMatrix4 *)local_2b0,(VRVector3 *)&local_1a0);
            operator*(&local_158,(VRMatrix4 *)local_2b0,&this->_R);
            VRMatrix4::~VRMatrix4((VRMatrix4 *)local_2b0);
            VRMatrix4::toVRFloatArray(&local_400,&local_158);
            VRTrackerEvent::createValidDataIndex
                      ((VRDataIndex *)local_2b0,&this->_eventName,&local_400);
            if (local_400.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_400.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_400.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_400.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            VRDataIndex::VRDataIndex(&local_c8,(VRDataIndex *)local_2b0);
            VRDataQueue::push(&this->_pendingEvents,&local_c8);
            VRDataIndex::~VRDataIndex(&local_c8);
            VRDataIndex::~VRDataIndex((VRDataIndex *)local_2b0);
            VRMatrix4::~VRMatrix4(&local_158);
            VRVector3::~VRVector3((VRVector3 *)&local_1a0);
            fVar8 = local_2c8;
            fVar9 = fStack_2c4;
          }
          this->_lastMouseX = fVar8;
          this->_lastMouseY = fVar9;
        }
        if (local_418 == (float *)0x0) {
          return;
        }
        operator_delete(local_418,local_408 - (long)local_418);
        return;
      }
    }
  }
  this->_state = XYTranslating;
  return;
}

Assistant:

void VRFakeHandTrackerDevice::onVREvent(const VRDataIndex &event)
{
    if (event.getName() == _toggleEvent) {
        _tracking = !_tracking;
        if (_tracking) {
            _state = VRFakeHandTrackerDevice::XYTranslating;
        }
    }
    else if (eventMatch(event.getName(), _zKeys, "Down")) {
        _state = VRFakeHandTrackerDevice::ZTranslating;
    }
    else if (eventMatch(event.getName(), _zKeys, "Up")) {
        _state = VRFakeHandTrackerDevice::XYTranslating;
    }
    else if (eventMatch(event.getName(), _rotKeys, "Down")) {
        _state = VRFakeHandTrackerDevice::Rotating;
    }
    else if (eventMatch(event.getName(), _rotKeys, "Up")) {
        _state = VRFakeHandTrackerDevice::XYTranslating;
    }
    else if (event.getName() == "Mouse_Move") {
        VRFloatArray screenPos = event.getValue("NormalizedPosition");
        if (screenPos.size() >= 2) {
            float mousex = 2.0f*(screenPos[0] - 0.5f);
            float mousey = 2.0f*((1.0f-screenPos[1]) - 0.5f);

            if (_tracking) {
                float deltaX = mousex - _lastMouseX;
                float deltaY = mousey - _lastMouseY;
            
                if (_state == VRFakeHandTrackerDevice::ZTranslating) {
                    _z += _zScale * deltaY;
                }
                else if (_state == VRFakeHandTrackerDevice::Rotating) {
                    _R = VRMatrix4::rotationY(_rScale*deltaX) * VRMatrix4::rotationX(-_rScale*deltaY) * _R;
                }
            
                VRVector3 pos = VRVector3(_xyScale * mousex, _xyScale * mousey, _z);
                VRMatrix4 xform  = VRMatrix4::translation(pos) * _R;

                VRDataIndex di = VRTrackerEvent::createValidDataIndex(_eventName, xform.toVRFloatArray());
                _pendingEvents.push(di);
            }
            
            _lastMouseX = mousex;
            _lastMouseY = mousey;
        }
    }
}